

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData *
GenerateKBIWeakSectorTrack
          (TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track,int weak_offset,
          int weak_size)

{
  int iVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar2;
  TrackData *this;
  int iVar3;
  Data *data;
  Sector *pSVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  Track *this_00;
  Sector *this_01;
  allocator_type local_14d;
  int local_14c;
  long local_148;
  int local_140;
  int local_13c;
  TrackData *local_138;
  Track *local_130;
  size_t __len;
  CylHead *local_120;
  Sector *local_118;
  Data dataW;
  FluxTrackBuilder fluxbuf;
  BitstreamTrackBuilder bitbuf;
  
  local_14c = weak_size;
  local_138 = __return_storage_ptr__;
  local_130 = track;
  local_120 = cylhead;
  FluxTrackBuilder::FluxTrackBuilder(&fluxbuf,cylhead,_250K,MFM);
  TrackBuilder::addTrackStart(&fluxbuf.super_TrackBuilder,false);
  BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
  TrackBuilder::addTrackStart(&bitbuf.super_TrackBuilder,false);
  this_00 = local_130;
  local_140 = Track::size(local_130);
  local_118 = (this_00->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_148 = (long)weak_offset;
  __len = (size_t)local_14c;
  local_140 = local_140 + -1;
  local_13c = local_140 / 2 + -1;
  for (this_01 = (this_00->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                 super__Vector_impl_data._M_start; this_01 != local_118; this_01 = this_01 + 1) {
    data = Sector::data_copy(this_01,0);
    iVar1 = (this_01->header).size;
    if (iVar1 == 1) {
      TrackBuilder::addSectorUpToData(&fluxbuf.super_TrackBuilder,&this_01->header,this_01->dam);
      __first._M_current =
           (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dataW,__first,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(__first._M_current + local_148),&local_14d);
      TrackBuilder::addBlock(&fluxbuf.super_TrackBuilder,&dataW);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dataW);
      FluxTrackBuilder::addWeakBlock(&fluxbuf,local_14c);
      puVar2 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = Sector::size(this_01);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&dataW,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar2 + __len + local_148),
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar2 + iVar3),&local_14d);
      TrackBuilder::addBlock(&fluxbuf.super_TrackBuilder,&dataW);
      this_00 = local_130;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dataW);
    }
    else {
      TrackBuilder::addSector
                (&fluxbuf.super_TrackBuilder,&this_01->header,data,0x54,this_01->dam,false);
    }
    TrackBuilder::addSector
              (&bitbuf.super_TrackBuilder,&this_01->header,data,1,this_01->dam,iVar1 == 1);
    pSVar4 = Track::operator[](this_00,local_13c);
    if (this_01 == pSVar4) {
      pSVar4 = Track::operator[](this_00,local_140);
      __x = &Sector::data_copy(pSVar4,0)->
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataW,__x);
      if (local_14c != 0) {
        memset(dataW.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + local_148,0xee,__len);
      }
      TrackBuilder::addSector(&bitbuf.super_TrackBuilder,&pSVar4->header,&dataW,1,pSVar4->dam,true);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dataW);
    }
  }
  TrackData::TrackData(local_138,local_120);
  this = local_138;
  bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
  TrackData::add(this,bitstream);
  BitBuffer::~BitBuffer(&bitbuf.m_buffer);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&fluxbuf.m_flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return this;
}

Assistant:

TrackData GenerateKBIWeakSectorTrack(const CylHead& cylhead, const Track& track, int weak_offset, int weak_size)
{
#ifdef _DEBUG
    int temp_offset, temp_size;
    assert(IsKBIWeakSectorTrack(track, temp_offset, temp_size));
    assert(weak_offset == temp_offset && weak_size == temp_size);
#endif

    FluxTrackBuilder fluxbuf(cylhead, DataRate::_250K, Encoding::MFM);
    fluxbuf.addTrackStart();

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    auto sectors = track.size();
    for (auto& sector : track)
    {
        auto& data_copy = sector.data_copy();
        auto is_weak = sector.header.size == 1;

        if (!is_weak)
            fluxbuf.addSector(sector.header, data_copy, 0x54, sector.dam);
        else
        {
            fluxbuf.addSectorUpToData(sector.header, sector.dam);
            fluxbuf.addBlock(Data(data_copy.begin(), data_copy.begin() + weak_offset));
            fluxbuf.addWeakBlock(weak_size);
            fluxbuf.addBlock(Data(
                data_copy.begin() + weak_offset + weak_size,
                data_copy.begin() + sector.size()));
        }

        bitbuf.addSector(sector.header, data_copy, 1, sector.dam, is_weak);

        // Insert the duplicate sector earlier on the track.
        if (&sector == &track[((sectors - 1) / 2) - 1])
        {
            auto& sectorW = track[sectors - 1];
            auto dataW{ sectorW.data_copy() };
            std::fill(dataW.begin() + weak_offset, dataW.begin() + weak_offset + weak_size, uint8_t(0xee));
            bitbuf.addSector(sectorW.header, dataW, 1, sectorW.dam, true);
        }
    }

    TrackData trackdata(cylhead);
    trackdata.add(std::move(bitbuf.buffer()));
    //trackdata.add(FluxData({ fluxbuf.buffer() }));
    return trackdata;
}